

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc.c
# Opt level: O0

int flatcc_generate_files(flatcc_context_t ctx)

{
  int iVar1;
  bool local_136;
  uint local_134;
  undefined1 local_130 [4];
  int ret;
  fb_output_t output;
  fb_output_t *out;
  fb_parser_t *P_leaf;
  fb_parser_t *P;
  flatcc_context_t ctx_local;
  
  local_134 = 0;
  output._248_8_ = local_130;
  if ((ctx == (flatcc_context_t)0x0) || (*(int *)((long)ctx + 0xd0) != 0)) {
    ctx_local._4_4_ = 0xffffffff;
  }
  else {
    out = (fb_output_t *)0x0;
    for (P_leaf = (fb_parser_t *)ctx; P_leaf != (fb_parser_t *)0x0; P_leaf = P_leaf->dependencies) {
      P_leaf->inverse_dependencies = (fb_parser_t *)out;
      out = (fb_output_t *)P_leaf;
    }
    if ((*(int *)((long)ctx + 0x1cc) == 0) ||
       (iVar1 = __flatcc_fb_codegen_bfbs_to_file
                          ((fb_options_t *)((long)ctx + 0xf0),(fb_schema_t *)((long)ctx + 0x208)),
       iVar1 == 0)) {
      if (*(int *)((long)ctx + 0x1cc) == 0) {
        iVar1 = __flatcc_fb_init_output_c
                          ((fb_output_t *)output._248_8_,(fb_options_t *)((long)ctx + 0xf0));
        if (iVar1 == 0) {
          if (((*(int *)((long)ctx + 400) != 0) ||
              (local_134 = __flatcc_fb_codegen_common_c((fb_output_t *)output._248_8_),
              local_134 == 0)) && (*(int *)((long)ctx + 0xec) != 0)) {
            if (*(int *)((long)ctx + 0x1bc) == 0) {
              local_134 = __flatcc_fb_codegen_c
                                    ((fb_output_t *)output._248_8_,
                                     (fb_schema_t *)((long)ctx + 0x208));
            }
            else {
              P_leaf = (fb_parser_t *)out;
              while (local_134 == 0 && P_leaf != (fb_parser_t *)0x0) {
                local_136 = true;
                if (P_leaf->failed == 0) {
                  iVar1 = __flatcc_fb_codegen_c((fb_output_t *)output._248_8_,&P_leaf->schema);
                  local_136 = iVar1 != 0;
                }
                P_leaf = P_leaf->inverse_dependencies;
                local_134 = (uint)local_136;
              }
            }
          }
          __flatcc_fb_end_output_c((fb_output_t *)output._248_8_);
          ctx_local._4_4_ = local_134;
        }
        else {
          ctx_local._4_4_ = 0xffffffff;
        }
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
    else {
      ctx_local._4_4_ = 0xffffffff;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int flatcc_generate_files(flatcc_context_t ctx)
{
    fb_parser_t *P = ctx, *P_leaf;
    fb_output_t *out, output;
    int ret = 0;
    out = &output;

    if (!P || P->failed) {
        return -1;
    }
    P_leaf = 0;
    while (P) {
        P->inverse_dependencies = P_leaf;
        P_leaf = P;
        P = P->dependencies;
    }
    P = ctx;
#if FLATCC_REFLECTION
    if (P->opts.bgen_bfbs) {
        if (fb_codegen_bfbs_to_file(&P->opts, &P->schema)) {
            return -1;
        }
    }
#endif
#ifdef PR216
    /* Note: P->opts.cgen now represents the below expression, and bfbs_gen is mutually exclusive with cgen */
    if (!(P->opts.cgen_reader | P->opts.cgen_builder | P->opts.cgen_verifier
        | P->opts.cgen_common_reader | P->opts.cgen_common_builder
        | P->opts.cgen_json_parser | P->opts.cgen_json_printer)) {
        return 0;
    }
#else
    /* Experimental alternative to PR216 */
    if (P->opts.bgen_bfbs) {
        return 0;
    }
#endif
    if (fb_init_output_c(out, &P->opts)) {
        return -1;
    }
    /* This does not require a parse first. */
    if (!P->opts.gen_append && (ret = fb_codegen_common_c(out))) {
        goto done;
    }
    /* If no file parsed - just common files if at all. */
    if (!P->has_schema) {
        goto done;
    }
    if (!P->opts.cgen_recursive) {
        ret = fb_codegen_c(out, &P->schema);
        goto done;
    }
    /* Make sure stdout and outfile output is generated in the right order. */
    P = P_leaf;
    while (!ret && P) {
        ret = P->failed || fb_codegen_c(out, &P->schema);
        P = P->inverse_dependencies;
    }
done:
    fb_end_output_c(out);
    return ret;
}